

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_FeatureValidationError_Test::
TestBody(CommandLineInterfaceTest_FeatureValidationError_Test *this)

{
  string_view local_78 [2];
  allocator<char> local_51;
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_FeatureValidationError_Test *local_10;
  CommandLineInterfaceTest_FeatureValidationError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    edition = \"2023\";\n    option features.field_presence = IMPLICIT;\n    message Foo {\n      int32 bar = 1 [default = 5, features.field_presence = FIELD_PRESENCE_UNKNOWN];\n      int32 baz = 2;\n    }"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto",&local_51);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_78,"`field_presence` must resolve to a known value, found FIELD_PRESENCE_UNKNOWN"
            );
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_78[0]);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, FeatureValidationError) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    option features.field_presence = IMPLICIT;
    message Foo {
      int32 bar = 1 [default = 5, features.field_presence = FIELD_PRESENCE_UNKNOWN];
      int32 baz = 2;
    })schema");

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "`field_presence` must resolve to a known value, found "
      "FIELD_PRESENCE_UNKNOWN");
}